

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O0

int ChebTools::get_decreasingleftofval<Eigen::Matrix<double,_1,1,0,_1,1>>
              (Matrix<double,__1,_1,_0,__1,_1> *breakpoints,double x,int N)

{
  int iVar1;
  int iVar2;
  CoeffReturnType pdVar3;
  int local_24;
  int iM;
  int iR;
  int iL;
  int N_local;
  double x_local;
  Matrix<double,__1,_1,_0,__1,_1> *breakpoints_local;
  
  iM = 0;
  iVar1 = N + -1;
  while (local_24 = iVar1, 1 < local_24 - iM) {
    iVar2 = midpoint_Knuth(iM,local_24);
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)breakpoints,
                        (long)iVar2);
    iVar1 = iVar2;
    if (x <= *pdVar3) {
      iVar1 = local_24;
      iM = iVar2;
    }
  }
  return iM;
}

Assistant:

int get_decreasingleftofval(const VecType& breakpoints, double x, int N) {
        int iL = 0, iR = N - 1, iM;
        while (iR - iL > 1) {
            iM = midpoint_Knuth(iL, iR);
            if (x <= breakpoints[iM]) {
                iL = iM;
            }
            else {
                iR = iM;
            }
        }
        return iL;
    }